

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.h
# Opt level: O0

TCGOpcode * tcg_swap_vecop_list(TCGOpcode *n)

{
  TCGOpcode *n_local;
  
  return (TCGOpcode *)0x0;
}

Assistant:

static inline const TCGOpcode *tcg_swap_vecop_list(const TCGOpcode *n)
{
#ifdef CONFIG_DEBUG_TCG
    const TCGOpcode *o = tcg_ctx->vecop_list;
    tcg_ctx->vecop_list = n;
    return o;
#else
    return NULL;
#endif
}